

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_param_parse.cpp
# Opt level: O3

run_param * run_param_parse::parse(int argc,char **argv)

{
  char *pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  run_param *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  double *pdVar7;
  ostream *poVar8;
  volume_mapping vmp;
  string memory;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  rest;
  string volumes_map;
  string memory_swap;
  parser run;
  undefined1 local_280 [32];
  _Alloc_hider local_260;
  size_type local_258;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  string local_240;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_220;
  long *local_208;
  long local_200;
  long local_1f8 [2];
  long *local_1e8;
  long local_1e0;
  long local_1d8 [2];
  string local_1c8;
  string local_1a8;
  string local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [72];
  _Alloc_hider local_a0;
  size_type local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  _Alloc_hider local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  pointer pbStack_48;
  pointer local_40;
  pointer pbStack_38;
  
  local_e8._24_8_ = local_e8 + 8;
  local_e8._8_4_ = _S_red;
  local_e8._16_8_ = (_Base_ptr)0x0;
  local_a0._M_p = (pointer)&local_90;
  local_e8._40_8_ = 0;
  local_e8._48_8_ = (pointer)0x0;
  local_e8._56_8_ = (pointer)0x0;
  local_e8._64_8_ = (pointer)0x0;
  local_98 = 0;
  local_90._M_local_buf[0] = '\0';
  local_80._M_p = (pointer)&local_70;
  local_78 = 0;
  local_70._M_local_buf[0] = '\0';
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_60.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pbStack_48 = (pointer)0x0;
  local_40 = (pointer)0x0;
  pbStack_38 = (pointer)0x0;
  pcVar1 = local_280 + 0x10;
  local_280._0_8_ = pcVar1;
  local_e8._32_8_ = local_e8._24_8_;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"interactive","");
  paVar2 = &local_240.field_2;
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,"Keep STDIN open even if not attached","");
  cmdline::parser::add((parser *)local_e8,(string *)local_280,'i',&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"tty","");
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Allocate a pseudo-TTY","");
  cmdline::parser::add((parser *)local_e8,(string *)local_280,'t',&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"detach","");
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,"Run container in background and print container ID","");
  cmdline::parser::add((parser *)local_e8,(string *)local_280,'d',&local_240);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"memory","");
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Memory limit","");
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"10m","");
  cmdline::parser::add<std::__cxx11::string>
            ((parser *)local_e8,(string *)local_280,'m',&local_240,false,&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"memory-swap","");
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,
             "Swap limit equal to memory plus swap: \'-1\' to enable unlimited swap","");
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"10m","");
  cmdline::parser::add<std::__cxx11::string>
            ((parser *)local_e8,(string *)local_280,'\0',&local_240,false,&local_148);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"name","");
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_240,"Assign a name to the containe","");
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  cmdline::parser::add<std::__cxx11::string>
            ((parser *)local_e8,(string *)local_280,'\0',&local_240,false,&local_108);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"volume","");
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Bind mount a volume","");
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"");
  cmdline::parser::add<std::__cxx11::string>
            ((parser *)local_e8,(string *)local_280,'v',&local_240,false,&local_168);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"cpus","");
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_240,"Number of CPUs","");
  cmdline::parser::add<double,cmdline::default_reader<double>>
            ((parser *)0x0,local_e8,local_280,0,&local_240,0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != paVar2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"image [image args]","");
  std::__cxx11::string::_M_assign((string *)&local_a0);
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  cmdline::parser::parse_check((parser *)local_e8,argc,argv);
  this = (run_param *)operator_new(0xb0);
  memset(this,0,0xb0);
  (this->image)._M_dataplus._M_p = (pointer)&(this->image).field_2;
  (this->image).field_2._M_local_buf[0] = '\0';
  (this->exec).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->exec).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->exec).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->volumes).super__Vector_base<volume_mapping,_std::allocator<volume_mapping>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->volumes).super__Vector_base<volume_mapping,_std::allocator<volume_mapping>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->volumes).super__Vector_base<volume_mapping,_std::allocator<volume_mapping>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  (this->name).field_2._M_local_buf[0] = '\0';
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"detach","");
  bVar4 = cmdline::parser::exist((parser *)local_e8,(string *)local_280);
  this->detach = bVar4;
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"interactive","");
  bVar4 = cmdline::parser::exist((parser *)local_e8,(string *)local_280);
  this->interactive = bVar4;
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"tty","");
  bVar4 = cmdline::parser::exist((parser *)local_e8,(string *)local_280);
  this->tty = bVar4;
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"memory","");
  pbVar6 = cmdline::parser::get<std::__cxx11::string>((parser *)local_e8,(string *)local_280);
  pcVar3 = (pbVar6->_M_dataplus)._M_p;
  local_240._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_240,pcVar3,pcVar3 + pbVar6->_M_string_length);
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_188,local_240._M_dataplus._M_p,
             local_240._M_dataplus._M_p + local_240._M_string_length);
  iVar5 = parse_utils::parse_memory(&local_188);
  this->memory = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"memory-swap","");
  pbVar6 = cmdline::parser::get<std::__cxx11::string>((parser *)local_e8,(string *)local_280);
  pcVar3 = (pbVar6->_M_dataplus)._M_p;
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1e8,pcVar3,pcVar3 + pbVar6->_M_string_length);
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1a8,local_1e8,local_1e0 + (long)local_1e8);
  iVar5 = parse_utils::parse_memory(&local_1a8);
  this->memory_swap = iVar5;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"cpus","");
  pdVar7 = cmdline::parser::get<double>((parser *)local_e8,(string *)local_280);
  this->cpus = *pdVar7;
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"name","");
  cmdline::parser::get<std::__cxx11::string>((parser *)local_e8,(string *)local_280);
  std::__cxx11::string::_M_assign((string *)&this->name);
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  uuid::generate_uuid_v4_abi_cxx11_();
  std::__cxx11::string::operator=((string *)&this->id,(string *)local_280);
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  local_280._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_280,"volume","");
  pbVar6 = cmdline::parser::get<std::__cxx11::string>((parser *)local_e8,(string *)local_280);
  pcVar3 = (pbVar6->_M_dataplus)._M_p;
  local_208 = local_1f8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_208,pcVar3,pcVar3 + pbVar6->_M_string_length);
  if ((char *)local_280._0_8_ != pcVar1) {
    operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
  }
  iVar5 = std::__cxx11::string::compare((char *)&local_208);
  if (iVar5 != 0) {
    local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1c8,local_208,local_200 + (long)local_208);
    string_utils::split(&local_220,&local_1c8,':');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    if ((long)local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_220.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0x40) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr," please using \'-v /path/to/src:/path/to/target\'",0x2f);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      goto LAB_001059bb;
    }
    local_280._8_8_ = 0;
    local_280[0x10] = '\0';
    local_258 = 0;
    local_250._M_local_buf[0] = '\0';
    local_280._0_8_ = pcVar1;
    local_260._M_p = (pointer)&local_250;
    std::__cxx11::string::_M_assign((string *)local_280);
    std::__cxx11::string::_M_assign((string *)&local_260);
    std::vector<volume_mapping,_std::allocator<volume_mapping>_>::push_back
              (&this->volumes,(value_type *)local_280);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_260._M_p != &local_250) {
      operator_delete(local_260._M_p,
                      CONCAT71(local_250._M_allocated_capacity._1_7_,local_250._M_local_buf[0]) + 1)
      ;
    }
    if ((char *)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_220);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_220,&local_60);
  if ((long)local_220.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish -
      (long)local_220.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != 0x20) {
    std::__cxx11::string::_M_assign((string *)&this->image);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_220,
               (iterator)
               local_220.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=(&this->exec,&local_220);
    run_param::to_string_abi_cxx11_((string *)local_280,this);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)local_280._0_8_,local_280._8_8_);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    if ((char *)local_280._0_8_ != pcVar1) {
      operator_delete((void *)local_280._0_8_,CONCAT71(local_280._17_7_,local_280[0x10]) + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_220);
    if (local_208 != local_1f8) {
      operator_delete(local_208,local_1f8[0] + 1);
    }
    if (local_1e8 != local_1d8) {
      operator_delete(local_1e8,local_1d8[0] + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != paVar2) {
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
    cmdline::parser::~parser((parser *)local_e8);
    return this;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"you should add image name",0x19);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
LAB_001059bb:
  exit(-1);
}

Assistant:

run_param *run_param_parse::parse(int argc, char *argv[]) {
  cmdline::parser run;

  run.add("interactive", 'i', "Keep STDIN open even if not attached");
  run.add("tty", 't', "Allocate a pseudo-TTY");
  run.add("detach", 'd', "Run container in background and print container ID");

  run.add<string>("memory", 'm', "Memory limit", false, "10m");
  run.add<string>(
      "memory-swap", 0,
      "Swap limit equal to memory plus swap: '-1' to enable unlimited swap",
      false, "10m");

  run.add<string>("name", 0, "Assign a name to the containe", false);
  run.add<string>("volume", 'v', "Bind mount a volume", false, "");

  run.add<double>("cpus", 0, "Number of CPUs", false, 1);

  run.footer("image [image args]");

  run.parse_check(argc, argv);

  auto *argc_run_param = new run_param();

  argc_run_param->detach = run.exist("detach");
  argc_run_param->interactive = run.exist("interactive");
  argc_run_param->tty = run.exist("tty");

  // memory
  string memory = run.get<string>("memory");
  argc_run_param->memory = parse_utils::parse_memory(memory);

  // memory swap
  string memory_swap = run.get<string>("memory-swap");
  argc_run_param->memory_swap = parse_utils::parse_memory(memory_swap);

  // cpu
  argc_run_param->cpus = run.get<double>("cpus");

  // name
  argc_run_param->name = run.get<string>("name");

  // id
  argc_run_param->id = uuid::generate_uuid_v4();

  // volumn
  string volumes_map = run.get<string>("volume");
  if (volumes_map != "") {
    vector<string> opts = string_utils::split(volumes_map, ':');
    if (opts.size() != 2) {
      cerr << " please using '-v /path/to/src:/path/to/target'" << endl;
      exit(-1);
    } else {
      volume_mapping vmp;
      vmp.from = opts[0];
      vmp.to = opts[1];
      argc_run_param->volumes.push_back(vmp);
    }
  }

  vector<string> rest = run.rest();

  // rest[0] = 'run'
  if (rest.size() == 1) {
    cerr << "you should add image name" << endl;
    exit(-1);
  }
  argc_run_param->image = rest[1];

  rest.erase(rest.begin());
  rest.erase(rest.begin());
  argc_run_param->exec = rest;

  cout << argc_run_param->to_string() << endl;

  return argc_run_param;
}